

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

char * __thiscall Fossilize::StateReplayer::Impl::duplicate_string(Impl *this,char *str,size_t len)

{
  char *__dest;
  
  if (len + 1 == 0) {
    __dest = (char *)0x0;
  }
  else {
    __dest = (char *)ScratchAllocator::allocate_raw(&this->allocator,len + 1,0x10);
  }
  memcpy(__dest,str,len);
  __dest[len] = '\0';
  return __dest;
}

Assistant:

const char *StateReplayer::Impl::duplicate_string(const char *str, size_t len)
{
	auto *c = allocator.allocate_n<char>(len + 1);
	memcpy(c, str, len);
	c[len] = '\0';
	return c;
}